

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int DLevelScript::ThingCount(int type,int stringid,int tid,int tag)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  PClassActor *this;
  char *name;
  AActor *pAVar4;
  PClassActor *pPVar5;
  DThinker *this_00;
  FActorIterator iterator;
  
  if (type < 1) {
    if (stringid < 0) {
      this = (PClassActor *)0x0;
    }
    else {
      name = FBehavior::StaticLookupString(stringid);
      if (name == (char *)0x0) {
        return 0;
      }
      this = PClass::FindActor(name);
      if (this == (PClassActor *)0x0) {
        return 0;
      }
    }
  }
  else {
    this = P_GetSpawnableType(type);
    if (this == (PClassActor *)0x0) {
      return 0;
    }
  }
  bVar1 = 1;
  iVar3 = 0;
  while( true ) {
    if (tid == 0) {
      TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&iterator,0x80);
      while (this_00 = FThinkerIterator::Next((FThinkerIterator *)&iterator),
            this_00 != (DThinker *)0x0) {
        if ((((0 < *(int *)((long)&this_00[8].super_DObject.Class + 4)) &&
             ((this == (PClassActor *)0x0 ||
              (pPVar5 = (PClassActor *)DObject::GetClass(&this_00->super_DObject), pPVar5 == this)))
             ) && ((tag == -1 ||
                   (bVar2 = FTagManager::SectorHasTag
                                      (&tagManager,(sector_t *)this_00[4].PrevThinker,tag), bVar2)))
            ) && ((bVar2 = DObject::IsKindOf(&this_00->super_DObject,
                                             AInventory::RegistrationInfo.MyClass), !bVar2 ||
                  (pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this_00[0x15].super_DObject.Class),
                  pAVar4 == (AActor *)0x0)))) {
          iVar3 = iVar3 + 1;
        }
      }
    }
    else {
      iterator.base = (AActor *)0x0;
      iterator.id = tid;
      while (pAVar4 = FActorIterator::Next(&iterator), pAVar4 != (AActor *)0x0) {
        if (((0 < pAVar4->health) &&
            ((this == (PClassActor *)0x0 ||
             (pPVar5 = (PClassActor *)DObject::GetClass((DObject *)pAVar4), pPVar5 == this)))) &&
           (((tag == -1 ||
             (bVar2 = FTagManager::SectorHasTag(&tagManager,pAVar4->Sector,tag), bVar2)) &&
            ((bVar2 = DObject::IsKindOf((DObject *)pAVar4,AInventory::RegistrationInfo.MyClass),
             !bVar2 || (pAVar4 = GC::ReadBarrier<AActor>((AActor **)(pAVar4 + 1)),
                       pAVar4 == (AActor *)0x0)))))) {
          iVar3 = iVar3 + 1;
        }
      }
    }
    if ((bool)(~bVar1 & 1 | this == (PClassActor *)0x0)) break;
    pPVar5 = PClassActor::GetReplacement(this,true);
    bVar1 = 0;
    bVar2 = pPVar5 == this;
    this = pPVar5;
    if (bVar2) {
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

int DLevelScript::ThingCount (int type, int stringid, int tid, int tag)
{
	AActor *actor;
	PClassActor *kind;
	int count = 0;
	bool replacemented = false;

	if (type > 0)
	{
		kind = P_GetSpawnableType(type);
		if (kind == NULL)
			return 0;
	}
	else if (stringid >= 0)
	{
		const char *type_name = FBehavior::StaticLookupString (stringid);
		if (type_name == NULL)
			return 0;

		kind = PClass::FindActor(type_name);
		if (kind == NULL)
			return 0;
	}
	else
	{
		kind = NULL;
	}

do_count:
	if (tid)
	{
		FActorIterator iterator (tid);
		while ( (actor = iterator.Next ()) )
		{
			if (actor->health > 0 &&
				(kind == NULL || actor->IsA (kind)))
			{
				if (tag == -1 || tagManager.SectorHasTag(actor->Sector, tag))
				{
					// Don't count items in somebody's inventory
					if (!actor->IsKindOf (RUNTIME_CLASS(AInventory)) ||
						static_cast<AInventory *>(actor)->Owner == NULL)
					{
						count++;
					}
				}
			}
		}
	}
	else
	{
		TThinkerIterator<AActor> iterator;
		while ( (actor = iterator.Next ()) )
		{
			if (actor->health > 0 &&
				(kind == NULL || actor->IsA (kind)))
			{
				if (tag == -1 || tagManager.SectorHasTag(actor->Sector, tag))
				{
					// Don't count items in somebody's inventory
					if (!actor->IsKindOf (RUNTIME_CLASS(AInventory)) ||
						static_cast<AInventory *>(actor)->Owner == NULL)
					{
						count++;
					}
				}
			}
		}
	}
	if (!replacemented && kind != NULL)
	{
		// Again, with decorate replacements
		replacemented = true;
		PClassActor *newkind = kind->GetReplacement();
		if (newkind != kind)
		{
			kind = newkind;
			goto do_count;
		}
	}
	return count;
}